

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error tt_hvadvance_adjust(TT_Face face,FT_UInt gindex,FT_Int *avalue,FT_Bool vertical)

{
  FT_Error FVar1;
  FT_Int FVar2;
  GX_ItemVarData varData;
  GX_HVVarTable pGStack_40;
  FT_UInt idx;
  GX_HVVarTable table;
  FT_UInt local_30;
  FT_Int delta;
  FT_UInt outerIndex;
  FT_UInt innerIndex;
  FT_Error error;
  FT_Bool vertical_local;
  FT_Int *avalue_local;
  FT_UInt gindex_local;
  TT_Face face_local;
  
  if ((face->doblend != '\0') && (face->blend != (GX_Blend)0x0)) {
    if (vertical == '\0') {
      if (face->blend->hvar_loaded == '\0') {
        FVar1 = ft_var_load_hvvar(face,'\0');
        face->blend->hvar_error = FVar1;
      }
      if (face->blend->hvar_checked == '\0') {
        return face->blend->hvar_error;
      }
      pGStack_40 = face->blend->hvar_table;
    }
    else {
      if (face->blend->vvar_loaded == '\0') {
        FVar1 = ft_var_load_hvvar(face,'\x01');
        face->blend->vvar_error = FVar1;
      }
      if (face->blend->vvar_checked == '\0') {
        return face->blend->vvar_error;
      }
      pGStack_40 = face->blend->vvar_table;
    }
    if ((pGStack_40->widthMap).innerIndex == (FT_UInt *)0x0) {
      local_30 = 0;
      delta = gindex;
      if (((pGStack_40->itemStore).varData)->itemCount <= gindex) {
        return 6;
      }
    }
    else {
      varData._4_4_ = gindex;
      if ((pGStack_40->widthMap).mapCount <= gindex) {
        varData._4_4_ = (pGStack_40->widthMap).mapCount - 1;
      }
      local_30 = (pGStack_40->widthMap).outerIndex[varData._4_4_];
      delta = (pGStack_40->widthMap).innerIndex[varData._4_4_];
    }
    FVar2 = ft_var_get_item_delta(face,&pGStack_40->itemStore,local_30,delta);
    *avalue = FVar2 + *avalue;
  }
  return 0;
}

Assistant:

static FT_Error
  tt_hvadvance_adjust( TT_Face  face,
                       FT_UInt  gindex,
                       FT_Int  *avalue,
                       FT_Bool  vertical )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   innerIndex, outerIndex;
    FT_Int    delta;

    GX_HVVarTable  table;


    if ( !face->doblend || !face->blend )
      goto Exit;

    if ( vertical )
    {
      if ( !face->blend->vvar_loaded )
      {
        /* initialize vvar table */
        face->blend->vvar_error = ft_var_load_hvvar( face, 1 );
      }

      if ( !face->blend->vvar_checked )
      {
        error = face->blend->vvar_error;
        goto Exit;
      }

      table = face->blend->vvar_table;
    }
    else
    {
      if ( !face->blend->hvar_loaded )
      {
        /* initialize hvar table */
        face->blend->hvar_error = ft_var_load_hvvar( face, 0 );
      }

      if ( !face->blend->hvar_checked )
      {
        error = face->blend->hvar_error;
        goto Exit;
      }

      table = face->blend->hvar_table;
    }

    /* advance width or height adjustments are always present in an */
    /* `HVAR' or `VVAR' table; no need to test for this capability  */

    if ( table->widthMap.innerIndex )
    {
      FT_UInt  idx = gindex;


      if ( idx >= table->widthMap.mapCount )
        idx = table->widthMap.mapCount - 1;

      /* trust that HVAR parser has checked indices */
      outerIndex = table->widthMap.outerIndex[idx];
      innerIndex = table->widthMap.innerIndex[idx];
    }
    else
    {
      GX_ItemVarData  varData;


      /* no widthMap data */
      outerIndex = 0;
      innerIndex = gindex;

      varData = &table->itemStore.varData[outerIndex];
      if ( gindex >= varData->itemCount )
      {
        FT_TRACE2(( "gindex %d out of range\n", gindex ));
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }
    }

    delta = ft_var_get_item_delta( face,
                                   &table->itemStore,
                                   outerIndex,
                                   innerIndex );

    FT_TRACE5(( "%s value %d adjusted by %d unit%s (%s)\n",
                vertical ? "vertical height" : "horizontal width",
                *avalue,
                delta,
                delta == 1 ? "" : "s",
                vertical ? "VVAR" : "HVAR" ));

    *avalue += delta;

  Exit:
    return error;
  }